

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O3

size_t chain::str::replace<(chain::str::case_t)1>
                 (string *data,string_view from,string_view to,optional<unsigned_long> count)

{
  size_type sVar1;
  size_t pos;
  size_t sVar2;
  _Storage<unsigned_long,_true> _Var3;
  string_view haystack;
  
  if (data->_M_string_length != 0) {
    _Var3._M_value = 0xffffffffffffffff;
    if (count.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged != false) {
      _Var3._M_value =
           count.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    }
    if (_Var3._M_value != 0) {
      pos = 0;
      sVar2 = 0;
      do {
        haystack._M_str = (data->_M_dataplus)._M_p;
        haystack._M_len = data->_M_string_length;
        sVar1 = find<(chain::str::case_t)1>(haystack,from,pos);
        if (sVar1 == 0xffffffffffffffff) {
          return sVar2;
        }
        std::__cxx11::string::replace((ulong)data,sVar1,(char *)from._M_len,(ulong)to._M_str);
        pos = sVar1 + to._M_len;
        sVar2 = sVar2 + 1;
      } while (_Var3._M_value != sVar2);
      return _Var3._M_value;
    }
  }
  return 0;
}

Assistant:

auto replace(
    std::string& data, std::string_view from, std::string_view to, std::optional<std::size_t> count = std::nullopt)
    -> std::size_t
{
    std::size_t replaced{0};

    if (!data.empty())
    {
        auto max = count.value_or(std::numeric_limits<std::size_t>::max());
        if (max == 0)
        {
            return replaced; // 0 replacements asked for...!
        }

        std::size_t pos{0};
        while ((pos = find<case_type>(data, from, pos)) != std::string_view::npos)
        {
            data.replace(pos, from.length(), to.data(), to.length());
            pos += to.length();
            ++replaced;

            if (replaced >= max)
            {
                break; // while()
            }
        }
    }

    return replaced;
}